

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

string * __thiscall module::getMingwLibs_abi_cxx11_(string *__return_storage_ptr__,module *this)

{
  mapped_type *pmVar1;
  allocator local_39;
  key_type local_38;
  
  std::__cxx11::string::string((string *)&local_38,"mingwLibs",&local_39);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->metaData,&local_38);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar1);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string module::getMingwLibs()
{
    return metaData [ META_MINGW_LIBS ];
}